

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_uses(lysp_yin_ctx *ctx,tree_node_meta *node_meta)

{
  lysp_node *plVar1;
  lysp_node *parent;
  LY_ERR ret___3;
  LY_ERR ret___2;
  yin_subelement subelems [8];
  tree_node_meta augments;
  LY_ERR ret___1;
  LY_ERR ret__;
  char **iter__;
  size_t offset__;
  char *p__;
  lysp_node_uses *uses;
  tree_node_meta *node_meta_local;
  lysp_yin_ctx *ctx_local;
  
  parent = (lysp_node *)calloc(1,0x58);
  if (parent == (lysp_node *)0x0) {
    ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_uses");
    ctx_local._4_4_ = LY_EMEM;
  }
  else {
    if (*node_meta->nodes == (lysp_node *)0x0) {
      *node_meta->nodes = parent;
    }
    else {
      plVar1 = *node_meta->nodes;
      while (_ret___1 = (long *)((long)plVar1 +
                                (long)*node_meta->nodes + (0x10 - (long)*node_meta->nodes)),
            *_ret___1 != 0) {
        plVar1 = (lysp_node *)*_ret___1;
      }
      *_ret___1 = (long)parent;
    }
    parent->nodetype = 0x800;
    parent->parent = node_meta->parent;
    ctx_local._4_4_ = lyxml_ctx_next(ctx->xmlctx);
    if ((ctx_local._4_4_ == LY_SUCCESS) &&
       (ctx_local._4_4_ =
             yin_parse_attribute(ctx,YIN_ARG_NAME,&parent->name,Y_PREF_IDENTIF_ARG,LY_STMT_USES),
       ctx_local._4_4_ == LY_SUCCESS)) {
      ret___3 = LY_EPLUGIN;
      subelems[0]._0_8_ = &subelems[7].flags;
      subelems[0].dest._0_2_ = 0;
      subelems[0].flags = 0;
      subelems[0]._18_2_ = 8;
      subelems[1]._0_8_ = &parent->dsc;
      subelems[1].dest._0_2_ = 2;
      subelems[1].flags = 0;
      subelems[1]._18_2_ = 0x13;
      subelems[2]._0_8_ = &parent->iffeatures;
      subelems[2].dest._0_2_ = 0;
      subelems[2].flags = 0;
      subelems[2]._18_2_ = 0x27;
      subelems[3]._0_8_ = &parent->ref;
      subelems[3].dest._0_2_ = 2;
      subelems[3].flags = 0;
      subelems[3]._18_2_ = 0x28;
      subelems[4]._0_8_ = parent + 1;
      subelems[4].dest._0_2_ = 0;
      subelems[4].flags = 0;
      subelems[4]._18_2_ = 0x2c;
      subelems[5]._0_8_ = &parent->flags;
      subelems[5].dest._0_2_ = 2;
      subelems[5].flags = 0;
      subelems[5]._18_2_ = 0x33;
      subelems[6]._0_8_ = &parent[1].next;
      subelems[6].dest._0_2_ = 2;
      subelems[7]._16_8_ = parent;
      memset(&subelems[6].flags,0,0x18);
      subelems[6].flags = 0;
      subelems[6]._18_2_ = 0xf;
      ctx_local._4_4_ =
           yin_parse_content(ctx,(yin_subelement *)&ret___3,8,parent,LY_STMT_USES,(char **)0x0,
                             &parent->exts);
      if ((ctx_local._4_4_ == LY_SUCCESS) &&
         (ctx_local._4_4_ = yin_unres_exts_add(ctx,parent->exts), ctx_local._4_4_ == LY_SUCCESS)) {
        ctx_local._4_4_ = LY_SUCCESS;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
yin_parse_uses(struct lysp_yin_ctx *ctx, struct tree_node_meta *node_meta)
{
    struct lysp_node_uses *uses;

    /* create new uses */
    LY_LIST_NEW_RET(ctx->xmlctx->ctx, node_meta->nodes, uses, next, LY_EMEM);
    uses->nodetype = LYS_USES;
    uses->parent = node_meta->parent;

    /* parse argument */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, &uses->name, Y_PREF_IDENTIF_ARG, LY_STMT_USES));

    /* parse content */
    struct tree_node_meta augments = {(struct lysp_node *)uses, (struct lysp_node **)&uses->augments};
    struct yin_subelement subelems[] = {
        {LY_STMT_AUGMENT, &augments, 0},
        {LY_STMT_DESCRIPTION, &uses->dsc, YIN_SUBELEM_UNIQUE},
        {LY_STMT_IF_FEATURE, &uses->iffeatures, 0},
        {LY_STMT_REFERENCE, &uses->ref, YIN_SUBELEM_UNIQUE},
        {LY_STMT_REFINE, &uses->refines, 0},
        {LY_STMT_STATUS, &uses->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_WHEN, &uses->when, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
    };

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), uses, LY_STMT_USES, NULL, &uses->exts));

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, uses->exts));

    return LY_SUCCESS;
}